

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cc
# Opt level: O1

Matrix3d * Util::matPOW(Matrix3d *__return_storage_ptr__,Matrix3d *mat,int n)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  Matrix3d *out;
  int iVar8;
  long lVar9;
  double *pdVar10;
  double *pdVar11;
  double dVar12;
  double dVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  double dVar18;
  double adStack_58 [2];
  type tmp;
  
  pdVar10 = (double *)mat;
  pdVar11 = (double *)__return_storage_ptr__;
  for (lVar9 = 9; lVar9 != 0; lVar9 = lVar9 + -1) {
    *pdVar11 = *pdVar10;
    pdVar10 = pdVar10 + 1;
    pdVar11 = pdVar11 + 1;
  }
  dVar12 = (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
           m_storage.m_data.array[0];
  dVar13 = (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
           m_storage.m_data.array[1];
  if (1 < n) {
    iVar8 = 1;
    uVar14 = *(undefined4 *)
              ((__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
               ).m_storage.m_data.array + 6);
    uVar15 = *(undefined4 *)
              ((long)(__return_storage_ptr__->
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
                     array + 0x34);
    uVar16 = *(undefined4 *)
              ((__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
               ).m_storage.m_data.array + 7);
    uVar17 = *(undefined4 *)
              ((long)(__return_storage_ptr__->
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
                     array + 0x3c);
    dVar18 = (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
             m_storage.m_data.array[8];
    do {
      dVar3 = (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>)
              .m_storage.m_data.array[2];
      dVar4 = (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>)
              .m_storage.m_data.array[3];
      dVar5 = (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>)
              .m_storage.m_data.array[4];
      dVar1 = (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>)
              .m_storage.m_data.array[5];
      lVar9 = 0x10;
      do {
        dVar2 = *(double *)
                 ((long)(mat->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                        m_storage.m_data.array + lVar9);
        pdVar10 = (double *)
                  ((long)(mat->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array + lVar9 + -0x10);
        dVar6 = *pdVar10;
        dVar7 = pdVar10[1];
        *(double *)((long)adStack_58 + lVar9) =
             dVar7 * dVar4 + dVar6 * dVar12 + dVar2 * (double)CONCAT44(uVar15,uVar14);
        *(double *)((long)adStack_58 + lVar9 + 8) =
             dVar7 * dVar5 + dVar6 * dVar13 + dVar2 * (double)CONCAT44(uVar17,uVar16);
        *(double *)
         ((long)tmp.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                array + lVar9) = dVar1 * dVar7 + dVar2 * dVar18 + dVar3 * dVar6;
        lVar9 = lVar9 + 0x18;
      } while (lVar9 != 0x58);
      (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
      m_storage.m_data.array[2] =
           tmp.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
           [2];
      (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
      m_storage.m_data.array[3] =
           tmp.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
           [3];
      (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
      m_storage.m_data.array[4] =
           tmp.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
           [4];
      (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
      m_storage.m_data.array[5] =
           tmp.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
           [5];
      iVar8 = iVar8 + 1;
      dVar12 = tmp.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
               array[0];
      dVar13 = tmp.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
               array[1];
      uVar14 = tmp.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
               array[6]._0_4_;
      uVar15 = tmp.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
               array[6]._4_4_;
      uVar16 = tmp.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
               array[7]._0_4_;
      uVar17 = tmp.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
               array[7]._4_4_;
      dVar18 = tmp.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
               array[8];
    } while (iVar8 != n);
    *(undefined4 *)
     ((__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
      m_storage.m_data.array + 6) =
         tmp.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6].
         _0_4_;
    *(undefined4 *)
     ((long)(__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
            m_storage.m_data.array + 0x34) =
         tmp.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6].
         _4_4_;
    *(undefined4 *)
     ((__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
      m_storage.m_data.array + 7) =
         tmp.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7].
         _0_4_;
    *(undefined4 *)
     ((long)(__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
            m_storage.m_data.array + 0x3c) =
         tmp.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7].
         _4_4_;
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
    .m_data.array[8] =
         tmp.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8];
  }
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[0] = dVar12;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[1] = dVar13;
  return __return_storage_ptr__;
}

Assistant:

Eigen::Matrix3d matPOW(Eigen::Matrix3d mat, int n){

		//initialize
		Eigen::Matrix3d out = mat;

		//cycle
		for (int i = 1; i < n; ++i)	{
			out = out*mat;
		}

		return out;

	}